

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::RandomWordTestData
          (RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this,wchar_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_38;
  __const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pRStack_10;
  wchar_t in_delim_local;
  RandomWordTestData<wchar_t,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._4_4_ = in_delim;
  pRStack_10 = this;
  std::__cxx11::wstring::wstring((wstring *)this);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::__cxx11::wstring::wstring((wstring *)&this->m_str);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->m_tokens);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_token_indexes);
  local_38._M_current =
       (wchar_t *)
       std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::end
                 (&this->m_delim);
  __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::__normal_iterator<wchar_t*>
            ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_30,&local_38);
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::insert
            (&this->m_delim,local_30,in_fixed_word_count_local._4_4_);
  populate(this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}